

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::store
          (PropertyT<OpenMesh::VectorT<double,_3>_> *this,ostream *_ostr,bool _swap)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  
  lVar5 = 0;
  sVar4 = 0;
  uVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])(this);
    if (CONCAT44(extraout_var,iVar1) <= uVar3) break;
    sVar2 = IO::binary<OpenMesh::VectorT<double,_3>_>::store
                      (_ostr,(value_type *)
                             ((long)(((this->data_).
                                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_VectorDataT<double,_3>).values_ + lVar5),_swap);
    sVar4 = sVar4 + sVar2;
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x18;
  }
  return sVar4;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }